

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O1

void __thiscall soul::heart::BranchIf::~BranchIf(BranchIf *this)

{
  uint64_t *puVar1;
  long lVar2;
  
  (this->super_Terminator).super_Object._vptr_Object = (_func_int **)&PTR__BranchIf_00307480;
  puVar1 = this->targetArgs[1].space;
  lVar2 = -0x70;
  do {
    puVar1[-2] = 0;
    if (4 < puVar1[-1]) {
      if (((ArgListType *)(puVar1 + -3))->items != (pool_ref<soul::heart::Expression> *)0x0) {
        operator_delete__(((ArgListType *)(puVar1 + -3))->items);
      }
      ((ArgListType *)(puVar1 + -3))->items = (pool_ref<soul::heart::Expression> *)puVar1;
      puVar1[-1] = 4;
    }
    puVar1 = puVar1 + -7;
    lVar2 = lVar2 + 0x38;
  } while (lVar2 != 0);
  Object::~Object((Object *)this);
  operator_delete(this,0xa0);
  return;
}

Assistant:

BranchIf (Expression& cond, Block& trueJump, Block& falseJump)
            : condition (cond), targets { trueJump, falseJump }
        {
            SOUL_ASSERT (targets[0] != targets[1]);
        }